

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_alter_nigel_colors.hpp
# Opt level: O1

void PatchAlterNigelColors::fix_sword_shade(ROM *rom)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  Sprite nigel_frame_60;
  Sprite nigel_frame_62;
  Sprite nigel_frame_32;
  Sprite nigel_frame_23;
  Sprite nigel_frame_39;
  Sprite nigel_frame_37;
  Sprite nigel_frame_36;
  Sprite nigel_frame_35;
  Sprite nigel_frame_33;
  Sprite nigel_frame_18;
  Sprite nigel_frame_16;
  Sprite nigel_frame_10;
  uint8_t *in_stack_fffffffffffffc58;
  allocator_type local_399;
  Sprite local_398;
  ByteArray local_368;
  Sprite local_348;
  Sprite local_318;
  Sprite local_2e8;
  Sprite local_2b8;
  Sprite local_288;
  Sprite local_258;
  Sprite local_228;
  Sprite local_1f8;
  Sprite local_1c8;
  Sprite local_198;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_160;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_130;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  Sprite local_40;
  
  fix_sword_shade_frame(rom,0x1220ae,'\v');
  fix_sword_shade_frame(rom,0x122a7c,'\v');
  fix_sword_shade_frame(rom,0x122d1a,'\v');
  fix_sword_shade_frame(rom,0x122f62,'\v');
  fix_sword_shade_frame(rom,0x1231a0,'\v');
  Sprite::decode_from(in_stack_fffffffffffffc58);
  Sprite::replace_color_in_tile(&local_40,'\t','\x06','\v');
  Sprite::set_pixel(&local_40,'\n','\a','\x06','\x06');
  Sprite::set_pixel(&local_40,'\n','\x06','\a','\x06');
  Sprite::encode((ByteArray *)&local_198,&local_40);
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_198._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_198._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_198._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_198._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x1233a8,&local_58);
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_198._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x123626,'\v');
  fix_sword_shade_frame(rom,0x123fa8,'\v');
  Sprite::decode_from(in_stack_fffffffffffffc58);
  Sprite::replace_color_in_tile(&local_198,'\t','\x06','\v');
  Sprite::set_pixel(&local_198,'\v','\0','\x02','\t');
  Sprite::encode((ByteArray *)&local_1c8,&local_198);
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1c8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1c8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1c8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1c8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x124200,&local_70);
  if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1c8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Sprite::decode_from(in_stack_fffffffffffffc58);
  Sprite::replace_color_in_tile(&local_1c8,'\t','\x06','\x06');
  Sprite::set_pixel(&local_1c8,'\n','\x03','\a','\x06');
  Sprite::replace_color_in_tile(&local_1c8,'\t','\x06','\v');
  Sprite::encode((ByteArray *)&local_2e8,&local_1c8);
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_2e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_2e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_2e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_2e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x124694,&local_88);
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x12493c,'\v');
  fix_sword_shade_frame(rom,0x124be2,'\v');
  fix_sword_shade_frame(rom,0x12510a,'\x0f');
  Sprite::decode_from(in_stack_fffffffffffffc58);
  Sprite::set_pixel(&local_2e8,'\x0f','\x05','\0','\x06');
  Sprite::set_pixel(&local_2e8,'\x0f','\x05','\x01','\x06');
  Sprite::set_pixel(&local_2e8,'\x0f','\x06','\x01','\x06');
  Sprite::set_pixel(&local_2e8,'\x0f','\x06','\x02','\x06');
  Sprite::encode((ByteArray *)&local_318,&local_2e8);
  local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_318._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_318._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_318._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_318._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_318._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x125370,&local_a0);
  if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_318._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_318._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_318._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x125616,'\v');
  local_1f8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_1f8._data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._2_6_,0xb0a);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_1f8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_318._data,__l,(allocator_type *)&local_228);
  fix_sword_shade_frame(rom,0x1258c2,&local_318._data);
  if (local_318._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_318._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_318._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x125b70,'\v');
  fix_sword_shade_frame(rom,0x125e24,'\v');
  fix_sword_shade_frame(rom,0x1260da,'\v');
  fix_sword_shade_frame(rom,0x126374,'\v');
  fix_sword_shade_frame(rom,0x1265e8,'\v');
  fix_sword_shade_frame(rom,0x126866,'\v');
  Sprite::decode_from(in_stack_fffffffffffffc58);
  Sprite::set_pixel(&local_318,'\n','\x06','\a','\x06');
  Sprite::set_pixel(&local_318,'\v','\x05','\0','\x06');
  Sprite::set_pixel(&local_318,'\v','\x04','\x01','\x06');
  Sprite::encode((ByteArray *)&local_1f8,&local_318);
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1f8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1f8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1f8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1f8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x126ac4,&local_b8);
  if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1f8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Sprite::decode_from(in_stack_fffffffffffffc58);
  Sprite::set_pixel(&local_1f8,'\n','\x06','\a','\x06');
  Sprite::set_pixel(&local_1f8,'\v','\x05','\0','\x06');
  Sprite::encode((ByteArray *)&local_228,&local_1f8);
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_228._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_228._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_228._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_228._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x126d66,&local_d0);
  if (local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_228._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x12700c,'\v');
  Sprite::decode_from(in_stack_fffffffffffffc58);
  Sprite::set_pixel(&local_228,'\n','\x06','\a','\x06');
  Sprite::replace_color_in_tile(&local_228,'\t','\x06','\v');
  Sprite::encode((ByteArray *)&local_258,&local_228);
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_258._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_258._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_258._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_258._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x1272ac,&local_e8);
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_258._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_258._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Sprite::decode_from(in_stack_fffffffffffffc58);
  Sprite::set_pixel(&local_258,'\n','\x06','\a','\x06');
  Sprite::set_pixel(&local_258,'\v','\x05','\0','\x06');
  Sprite::set_pixel(&local_258,'\v','\x04','\x01','\x06');
  Sprite::encode((ByteArray *)&local_288,&local_258);
  local_100.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_288._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_100.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_288._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_100.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_288._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_288._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_288._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x127546,&local_100);
  if (local_100.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_288._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_288._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_288._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Sprite::decode_from(in_stack_fffffffffffffc58);
  Sprite::set_pixel(&local_288,'\n','\x05','\a','\x06');
  Sprite::set_pixel(&local_288,'\n','\x06','\x06','\x06');
  Sprite::set_pixel(&local_288,'\v','\x04','\0','\x06');
  Sprite::encode((ByteArray *)&local_2b8,&local_288);
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_2b8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_2b8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_2b8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_2b8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x1277d0,&local_118);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2b8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x127a50,'\v');
  Sprite::decode_from(in_stack_fffffffffffffc58);
  Sprite::set_pixel(&local_2b8,'\v','\x06','\x01','\x06');
  Sprite::set_pixel(&local_2b8,'\v','\x05','\x02','\x06');
  Sprite::set_pixel(&local_2b8,'\v','\x04','\x03','\x06');
  Sprite::encode((ByteArray *)&local_398,&local_2b8);
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x127cc8,&local_130);
  if (local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x127f28,'\n');
  fix_sword_shade_frame(rom,0x128126,'\n');
  fix_sword_shade_frame(rom,0x128340,'\n');
  local_348._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_348._data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._2_6_,0xb0a);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_348;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_398._data,__l_00,(allocator_type *)&local_368);
  fix_sword_shade_frame(rom,0x12859a,&local_398._data);
  if (local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x1287fa,'\n');
  fix_sword_shade_frame(rom,0x128a10,'\n');
  fix_sword_shade_frame(rom,0x128c36,'\n');
  local_348._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_348._data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._2_6_,0xb0a);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_348;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_398._data,__l_01,(allocator_type *)&local_368);
  fix_sword_shade_frame(rom,0x128e6c,&local_398._data);
  if (local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_348._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT53(local_348._data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._3_5_,0xf0e0a);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&local_348;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_398._data,__l_02,(allocator_type *)&local_368);
  fix_sword_shade_frame(rom,0x1290c4,&local_398._data);
  if (local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  fix_sword_shade_frame(rom,0x129324,'\n');
  local_348._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT53(local_348._data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._3_5_,0xb0a06);
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&local_348;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_398._data,__l_03,(allocator_type *)&local_368);
  fix_sword_shade_frame(rom,0x1295d2,&local_398._data);
  if (local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Sprite::decode_from(in_stack_fffffffffffffc58);
  Sprite::set_pixel(&local_398,'\n','\x01','\a','\x06');
  Sprite::set_pixel(&local_398,'\n','\x05','\a','\x06');
  Sprite::set_pixel(&local_398,'\n','\x06','\a','\x06');
  Sprite::replace_color_in_tile(&local_398,'\t','\x06','\v');
  Sprite::encode((ByteArray *)&local_348,&local_398);
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_348._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_348._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_348._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_348._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_348._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x12b990,&local_148);
  if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_348._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_348._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_368.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT62(local_368.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                               .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._2_6_,0xb0a);
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&local_368;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_348._data,__l_04,&local_399);
  fix_sword_shade_frame(rom,0x12bb9e,&local_348._data);
  if (local_348._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_348._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Sprite::decode_from(in_stack_fffffffffffffc58);
  Sprite::set_pixel(&local_348,'\n','\x02','\a','\x06');
  Sprite::replace_color_in_tile(&local_348,'\t','\x06','\v');
  Sprite::encode(&local_368,&local_348);
  local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_368.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_368.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_368.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_368.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_368.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_368.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  md::ROM::set_bytes(rom,0x12bdfe,&local_160);
  if (local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_160.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_368.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_368.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_368.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_368.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_348._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_348._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_348._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_348._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_348._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_398._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_398._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_398._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_398._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_398._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2b8._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_288._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_288._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_288._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_288._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_258._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_258._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_258._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_258._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_228._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_228._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_228._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f8._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1f8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_318._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_318._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_318._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_318._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_318._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_318._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2e8._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c8._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1c8._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_198._subsprites.
      super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_198._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198._data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_40._subsprites.super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40._subsprites.
                    super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40._subsprites.
                          super__Vector_base<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void fix_sword_shade(md::ROM& rom)
    {
        fix_sword_shade_frame(rom, 0x1220AE, 11); // SpriteGfx000Frame02
        fix_sword_shade_frame(rom, 0x122A7C, 11); // SpriteGfx000Frame06
        fix_sword_shade_frame(rom, 0x122D1A, 11); // SpriteGfx000Frame07
        fix_sword_shade_frame(rom, 0x122F62, 11); // SpriteGfx000Frame08
        fix_sword_shade_frame(rom, 0x1231A0, 11); // SpriteGfx000Frame09

        Sprite nigel_frame_10 = Sprite::decode_from(rom.iterator_at(0x1233A8));
        nigel_frame_10.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        nigel_frame_10.set_pixel(10, 7, 6, COLOR_SWORD_REPLACEMENT);
        nigel_frame_10.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x1233A8, nigel_frame_10.encode());

        fix_sword_shade_frame(rom, 0x123626, 11); // SpriteGfx000Frame11
        fix_sword_shade_frame(rom, 0x123FA8, 11); // SpriteGfx000Frame15

        Sprite nigel_frame_16 = Sprite::decode_from(rom.iterator_at(0x124200));
        nigel_frame_16.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        nigel_frame_16.set_pixel(11, 0, 2, COLOR_SWORD_WRONG);
        rom.set_bytes(0x124200, nigel_frame_16.encode());

        Sprite nigel_frame_18 = Sprite::decode_from(rom.iterator_at(0x124694));
        nigel_frame_18.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 6);
        nigel_frame_18.set_pixel(10, 3, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_18.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        rom.set_bytes(0x124694, nigel_frame_18.encode());

        fix_sword_shade_frame(rom, 0x12493C, 11); // SpriteGfx000Frame19
        fix_sword_shade_frame(rom, 0x124BE2, 11); // SpriteGfx000Frame20

        // --- Anim dropping held item, facing camera ----------------------------
        fix_sword_shade_frame(rom, 0x12510A, 15); // SpriteGfx000Frame22

        Sprite nigel_frame_23 = Sprite::decode_from(rom.iterator_at(0x125370));
        nigel_frame_23.set_pixel(15, 5, 0, COLOR_SWORD_REPLACEMENT);
        nigel_frame_23.set_pixel(15, 5, 1, COLOR_SWORD_REPLACEMENT);
        nigel_frame_23.set_pixel(15, 6, 1, COLOR_SWORD_REPLACEMENT);
        nigel_frame_23.set_pixel(15, 6, 2, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x125370, nigel_frame_23.encode());

        // --- Anim held item, not looking camera ----------------------------
        fix_sword_shade_frame(rom, 0x125616, 11); // SpriteGfx000Frame24
        fix_sword_shade_frame(rom, 0x1258C2, {10, 11}); // SpriteGfx000Frame25
        fix_sword_shade_frame(rom, 0x125B70, 11); // SpriteGfx000Frame26
        fix_sword_shade_frame(rom, 0x125E24, 11); // SpriteGfx000Frame27
        fix_sword_shade_frame(rom, 0x1260DA, 11); // SpriteGfx000Frame28
        fix_sword_shade_frame(rom, 0x126374, 11); // SpriteGfx000Frame29
        fix_sword_shade_frame(rom, 0x1265E8, 11); // SpriteGfx000Frame30
        fix_sword_shade_frame(rom, 0x126866, 11); // SpriteGfx000Frame31

        // --- Anim held item, facing camera ----------------------------
        Sprite nigel_frame_32 = Sprite::decode_from(rom.iterator_at(0x126AC4));
        nigel_frame_32.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_32.set_pixel(11, 5, 0, COLOR_SWORD_REPLACEMENT);
        nigel_frame_32.set_pixel(11, 4, 1, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x126AC4, nigel_frame_32.encode());

        Sprite nigel_frame_33 = Sprite::decode_from(rom.iterator_at(0x126D66));
        nigel_frame_33.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_33.set_pixel(11, 5, 0, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x126D66, nigel_frame_33.encode());

        fix_sword_shade_frame(rom, 0x12700C, 11); // SpriteGfx000Frame34

        Sprite nigel_frame_35 = Sprite::decode_from(rom.iterator_at(0x1272AC));
        nigel_frame_35.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_35.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        rom.set_bytes(0x1272AC, nigel_frame_35.encode());

        Sprite nigel_frame_36 = Sprite::decode_from(rom.iterator_at(0x127546));
        nigel_frame_36.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_36.set_pixel(11, 5, 0, COLOR_SWORD_REPLACEMENT);
        nigel_frame_36.set_pixel(11, 4, 1, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x127546, nigel_frame_36.encode());

        Sprite nigel_frame_37 = Sprite::decode_from(rom.iterator_at(0x1277D0));
        nigel_frame_37.set_pixel(10, 5, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_37.set_pixel(10, 6, 6, COLOR_SWORD_REPLACEMENT);
        nigel_frame_37.set_pixel(11, 4, 0, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x1277D0, nigel_frame_37.encode());

        fix_sword_shade_frame(rom, 0x127A50, 11); // SpriteGfx000Frame38

        Sprite nigel_frame_39 = Sprite::decode_from(rom.iterator_at(0x127CC8));
        nigel_frame_39.set_pixel(11, 6, 1, COLOR_SWORD_REPLACEMENT);
        nigel_frame_39.set_pixel(11, 5, 2, COLOR_SWORD_REPLACEMENT);
        nigel_frame_39.set_pixel(11, 4, 3, COLOR_SWORD_REPLACEMENT);
        rom.set_bytes(0x127CC8, nigel_frame_39.encode());

        // --- Anim jumping, not looking at camera ----------------------------
        fix_sword_shade_frame(rom, 0x127F28, 10); // SpriteGfx000Frame40
        fix_sword_shade_frame(rom, 0x128126, 10); // SpriteGfx000Frame41

        // --- Anim jumping, facing camera ----------------------------
        fix_sword_shade_frame(rom, 0x128340, 10); // SpriteGfx000Frame42
        fix_sword_shade_frame(rom, 0x12859A, {10, 11}); // SpriteGfx000Frame43

        // --- Anim jumping holding something, not looking at camera ----------------------------
        fix_sword_shade_frame(rom, 0x1287FA, 10); // SpriteGfx000Frame44
        fix_sword_shade_frame(rom, 0x128A10, 10); // SpriteGfx000Frame45

        // --- Anim jumping holding something, facing camera ----------------------------
        fix_sword_shade_frame(rom, 0x128C36, 10); // SpriteGfx000Frame46
        fix_sword_shade_frame(rom, 0x128E6C, {10, 11}); // SpriteGfx000Frame47

        // --- Anim jumping throwing something, not looking at camera ----------------------------
        fix_sword_shade_frame(rom, 0x1290C4, {10, 14, 15}); // SpriteGfx000Frame48
        fix_sword_shade_frame(rom, 0x129324, 10); // SpriteGfx000Frame49

        // --- Anim jumping throwing something, facing camera ----------------------------
        fix_sword_shade_frame(rom, 0x1295D2, {6, 10, 11}); // SpriteGfx000Frame50

        // --- Anim climbing, not looking at camera ----------------------------
        Sprite nigel_frame_60 = Sprite::decode_from(rom.iterator_at(0x12B990));
        nigel_frame_60.set_pixel(10, 1, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_60.set_pixel(10, 5, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_60.set_pixel(10, 6, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_60.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        rom.set_bytes(0x12B990, nigel_frame_60.encode());

        fix_sword_shade_frame(rom, 0x12BB9E, {10, 11}); // SpriteGfx000Frame61

        Sprite nigel_frame_62 = Sprite::decode_from(rom.iterator_at(0x12BDFE));
        nigel_frame_62.set_pixel(10, 2, 7, COLOR_SWORD_REPLACEMENT);
        nigel_frame_62.replace_color_in_tile(COLOR_SWORD_WRONG, COLOR_SWORD_REPLACEMENT, 11);
        rom.set_bytes(0x12BDFE, nigel_frame_62.encode());
    }